

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this,cmGeneratorTarget *gt)

{
  mapped_type pcVar1;
  mapped_type *ppcVar2;
  char *pcVar3;
  allocator local_4b;
  undefined1 local_4a;
  byte local_49;
  ulong uStack_48;
  uchar c;
  size_t i;
  char *b;
  char buf [17];
  cmGeneratorTarget *gt_local;
  cmGlobalGenerator *this_local;
  string *id;
  
  stack0xffffffffffffffe0 = gt;
  i = (long)&b + 1;
  b._0_1_ = 0x3a;
  for (uStack_48 = 0; uStack_48 < 8; uStack_48 = uStack_48 + 1) {
    local_49 = buf[uStack_48 + 0x10];
    pcVar3 = (char *)(i + 1);
    *(char *)i = "0123456789abcdef"[(int)(local_49 & 0xf0) >> 4];
    i = i + 2;
    *pcVar3 = "0123456789abcdef"[(int)(local_49 & 0xf)];
  }
  local_4a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&b,0x11,&local_4b);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b);
  pcVar1 = stack0xffffffffffffffe0;
  ppcVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>_>
            ::operator[](&this->GeneratorTargetSearchIndex,__return_storage_ptr__);
  *ppcVar2 = pcVar1;
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::IndexGeneratorTargetUniquely(
  cmGeneratorTarget const* gt)
{
  // Use the pointer value to uniquely identify the target instance.
  // Use a ":" prefix to avoid conflict with project-defined targets.
  // We must satisfy cmGeneratorExpression::IsValidTargetName so use no
  // other special characters.
  char buf[1 + sizeof(gt) * 2];
  char* b = buf;
  *b++ = ':';
  for (size_t i = 0; i < sizeof(gt); ++i) {
    unsigned char const c = reinterpret_cast<unsigned char const*>(&gt)[i];
    *b++ = hexDigits[(c & 0xf0) >> 4];
    *b++ = hexDigits[(c & 0x0f)];
  }
  std::string id(buf, sizeof(buf));
  // We internally index pointers to non-const generator targets
  // but our callers only have pointers to const generator targets.
  // They will give up non-const privileges when looking up anyway.
  this->GeneratorTargetSearchIndex[id] = const_cast<cmGeneratorTarget*>(gt);
  return id;
}